

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::setInterfaceProperty(FederateState *this,ActionMessage *cmd)

{
  char cVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  InputInfo *pIVar5;
  PublicationInfo *pPVar6;
  EndpointInfo *pEVar7;
  uint uVar8;
  undefined1 *puVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view logMessageSource;
  string_view fmt_00;
  string_view logMessageSource_00;
  string_view fmt_01;
  string_view logMessageSource_01;
  string_view fmt_02;
  string_view logMessageSource_02;
  string_view fmt_03;
  string_view logMessageSource_03;
  string_view fmt_04;
  string_view logMessageSource_04;
  format_args args;
  string_view message;
  format_args args_00;
  string_view message_00;
  format_args args_01;
  string_view message_01;
  format_args args_02;
  string_view message_02;
  format_args args_03;
  string_view message_03;
  format_args args_04;
  string_view message_04;
  string local_68;
  string local_48;
  
  if (cmd->messageAction != cmd_interface_configure) {
    return;
  }
  cVar1 = (char)cmd->counter;
  if (cVar1 == 'e') {
    uVar8 = cmd->flags & 0x20;
    if ((cmd->flags & 0x20) != 0) {
      uVar8 = (cmd->source_handle).hid;
    }
    bVar4 = InterfaceInfo::setEndpointProperty
                      (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid,
                       cmd->messageID,uVar8);
    if (bVar4) {
      return;
    }
    pEVar7 = InterfaceInfo::getEndpoint
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var2 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (pEVar7 == (EndpointInfo *)0x0) {
      local_68._M_dataplus._M_p._0_4_ = cmd->messageID;
      fmt_03.size_ = 1;
      fmt_03.data_ = (char *)0x2f;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_48,(v11 *)"property {} not used on due to unknown endpoint",fmt_03,args_03);
      message_03._M_str._4_4_ = local_48._M_dataplus._M_p._4_4_;
      message_03._M_str._0_4_ = (int32_t)local_48._M_dataplus._M_p;
      logMessageSource_03._M_str = _Var2._M_p;
      logMessageSource_03._M_len = sVar3;
      message_03._M_len = local_48._M_string_length;
      logMessage(this,3,logMessageSource_03,message_03,false);
      goto LAB_002c6d71;
    }
    local_48._M_dataplus._M_p._0_4_ = cmd->messageID;
    local_48.field_2._M_allocated_capacity = (size_type)(pEVar7->key)._M_dataplus._M_p;
    local_48.field_2._8_8_ = (pEVar7->key)._M_string_length;
    fmt_01.size_ = 0xd1;
    fmt_01.data_ = (char *)0x23;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_68,(v11 *)"property {} not used on endpoint {}",fmt_01,args_01);
    message_01._M_str._4_4_ = local_68._M_dataplus._M_p._4_4_;
    message_01._M_str._0_4_ = (int32_t)local_68._M_dataplus._M_p;
    logMessageSource_01._M_str = _Var2._M_p;
    logMessageSource_01._M_len = sVar3;
    message_01._M_len = local_68._M_string_length;
    logMessage(this,3,logMessageSource_01,message_01,false);
  }
  else if (cVar1 == 'p') {
    uVar8 = cmd->flags & 0x20;
    if ((cmd->flags & 0x20) != 0) {
      uVar8 = (cmd->source_handle).hid;
    }
    bVar4 = InterfaceInfo::setPublicationProperty
                      (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid,
                       cmd->messageID,uVar8);
    if (bVar4) {
      return;
    }
    pPVar6 = InterfaceInfo::getPublication
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var2 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (pPVar6 == (PublicationInfo *)0x0) {
      local_68._M_dataplus._M_p._0_4_ = cmd->messageID;
      fmt_02.size_ = 1;
      fmt_02.data_ = (char *)0x32;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_48,(v11 *)"property {} not used on due to unknown publication",fmt_02,
                 args_02);
      message_02._M_str._4_4_ = local_48._M_dataplus._M_p._4_4_;
      message_02._M_str._0_4_ = (int32_t)local_48._M_dataplus._M_p;
      logMessageSource_02._M_str = _Var2._M_p;
      logMessageSource_02._M_len = sVar3;
      message_02._M_len = local_48._M_string_length;
      logMessage(this,3,logMessageSource_02,message_02,false);
      goto LAB_002c6d71;
    }
    local_48._M_dataplus._M_p._0_4_ = cmd->messageID;
    local_48.field_2._M_allocated_capacity = (size_type)(pPVar6->key)._M_dataplus._M_p;
    local_48.field_2._8_8_ = (pPVar6->key)._M_string_length;
    fmt_00.size_ = 0xd1;
    fmt_00.data_ = (char *)0x26;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_68,(v11 *)"property {} not used on publication {}",fmt_00,args_00);
    message_00._M_str._4_4_ = local_68._M_dataplus._M_p._4_4_;
    message_00._M_str._0_4_ = (int32_t)local_68._M_dataplus._M_p;
    logMessageSource_00._M_str = _Var2._M_p;
    logMessageSource_00._M_len = sVar3;
    message_00._M_len = local_68._M_string_length;
    logMessage(this,3,logMessageSource_00,message_00,false);
  }
  else {
    if (cVar1 != 'i') {
      return;
    }
    uVar8 = cmd->flags & 0x20;
    if ((cmd->flags & 0x20) != 0) {
      uVar8 = (cmd->source_handle).hid;
    }
    bVar4 = InterfaceInfo::setInputProperty
                      (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid,
                       cmd->messageID,uVar8);
    if (bVar4) {
      return;
    }
    pIVar5 = InterfaceInfo::getInput
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var2 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (pIVar5 == (InputInfo *)0x0) {
      local_68._M_dataplus._M_p._0_4_ = cmd->messageID;
      fmt_04.size_ = 1;
      fmt_04.data_ = (char *)0x2c;
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_48,(v11 *)"property {} not used on due to unknown input",fmt_04,args_04);
      message_04._M_str._4_4_ = local_48._M_dataplus._M_p._4_4_;
      message_04._M_str._0_4_ = (int32_t)local_48._M_dataplus._M_p;
      logMessageSource_04._M_str = _Var2._M_p;
      logMessageSource_04._M_len = sVar3;
      message_04._M_len = local_48._M_string_length;
      logMessage(this,3,logMessageSource_04,message_04,false);
LAB_002c6d71:
      puVar9 = (undefined1 *)
               CONCAT44(local_48._M_dataplus._M_p._4_4_,(int32_t)local_48._M_dataplus._M_p);
      local_68.field_2._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9 == &local_48.field_2) {
        return;
      }
      goto LAB_002c6d84;
    }
    local_48._M_dataplus._M_p._0_4_ = cmd->messageID;
    local_48.field_2._M_allocated_capacity = (size_type)(pIVar5->key)._M_dataplus._M_p;
    local_48.field_2._8_8_ = (pIVar5->key)._M_string_length;
    fmt.size_ = 0xd1;
    fmt.data_ = (char *)0x20;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"property {} not used on input {}",fmt,args);
    message._M_str._4_4_ = local_68._M_dataplus._M_p._4_4_;
    message._M_str._0_4_ = (int32_t)local_68._M_dataplus._M_p;
    logMessageSource._M_str = _Var2._M_p;
    logMessageSource._M_len = sVar3;
    message._M_len = local_68._M_string_length;
    logMessage(this,3,logMessageSource,message,false);
  }
  puVar9 = (undefined1 *)
           CONCAT44(local_68._M_dataplus._M_p._4_4_,(int32_t)local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9 == &local_68.field_2) {
    return;
  }
LAB_002c6d84:
  operator_delete(puVar9,(ulong)(local_68.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void FederateState::setInterfaceProperty(const ActionMessage& cmd)
{
    if (cmd.action() != CMD_INTERFACE_CONFIGURE) {
        return;
    }
    bool used = false;
    switch (static_cast<char>(cmd.counter)) {
        case 'i':
            used = interfaceInformation.setInputProperty(cmd.dest_handle,
                                                         cmd.messageID,
                                                         checkActionFlag(cmd, indicator_flag) ?
                                                             cmd.getExtraDestData() :
                                                             0);
            if (!used) {
                auto* ipt = interfaceInformation.getInput(cmd.dest_handle);
                if (ipt != nullptr) {
                    LOG_WARNING(
                        fmt::format("property {} not used on input {}", cmd.messageID, ipt->key));
                } else {
                    LOG_WARNING(
                        fmt::format("property {} not used on due to unknown input", cmd.messageID));
                }
            }
            break;
        case 'p':
            used =
                interfaceInformation.setPublicationProperty(cmd.dest_handle,
                                                            cmd.messageID,
                                                            checkActionFlag(cmd, indicator_flag) ?
                                                                cmd.getExtraDestData() :
                                                                0);
            if (!used) {
                auto* pub = interfaceInformation.getPublication(cmd.dest_handle);
                if (pub != nullptr) {
                    LOG_WARNING(fmt::format("property {} not used on publication {}",
                                            cmd.messageID,
                                            pub->key));
                } else {
                    LOG_WARNING(fmt::format("property {} not used on due to unknown publication",
                                            cmd.messageID));
                }
            }
            break;
        case 'e':
            used = interfaceInformation.setEndpointProperty(cmd.dest_handle,
                                                            cmd.messageID,
                                                            checkActionFlag(cmd, indicator_flag) ?
                                                                cmd.getExtraDestData() :
                                                                0);
            if (!used) {
                auto* ept = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (ept != nullptr) {
                    LOG_WARNING(fmt::format("property {} not used on endpoint {}",
                                            cmd.messageID,
                                            ept->key));
                } else {
                    LOG_WARNING(fmt::format("property {} not used on due to unknown endpoint",
                                            cmd.messageID));
                }
            }
            break;
        default:
            break;
    }
}